

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O2

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  HighsStatus HVar1;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)matrix_name);
  HVar1 = assessMatrix(log_options,&local_50,vec_dim,num_vec,false,matrix_start,matrix_p_end,
                       matrix_index,matrix_value,small_matrix_value,large_matrix_value);
  std::__cxx11::string::~string((string *)&local_50);
  return HVar1;
}

Assistant:

HighsStatus assessMatrix(const HighsLogOptions& log_options,
                         const std::string matrix_name, const HighsInt vec_dim,
                         const HighsInt num_vec, vector<HighsInt>& matrix_start,
                         vector<HighsInt>& matrix_p_end,
                         vector<HighsInt>& matrix_index,
                         vector<double>& matrix_value,
                         const double small_matrix_value,
                         const double large_matrix_value) {
  const bool partitioned = false;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      matrix_start, matrix_p_end, matrix_index, matrix_value,
                      small_matrix_value, large_matrix_value);
}